

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O1

int ts_subtree_compare(Subtree left,Subtree right)

{
  Subtree *pSVar1;
  Subtree *pSVar2;
  bool bVar3;
  int iVar4;
  int unaff_EBP;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  TSSymbol TVar8;
  ushort uVar9;
  uint32_t uVar10;
  ulong uVar11;
  
  if (((ulong)left.ptr & 1) == 0) {
    uVar5 = (left.ptr)->symbol;
  }
  else {
    uVar5 = (ushort)left.data.symbol;
  }
  if (((ulong)right.ptr & 1) == 0) {
    TVar8 = (right.ptr)->symbol;
  }
  else {
    TVar8 = (TSSymbol)right.data.symbol;
  }
  iVar4 = -1;
  if (TVar8 <= uVar5) {
    if (((ulong)right.ptr & 1) == 0) {
      uVar5 = (right.ptr)->symbol;
    }
    else {
      uVar5 = (ushort)right.data.symbol;
    }
    if (((ulong)left.ptr & 1) == 0) {
      uVar9 = (left.ptr)->symbol;
    }
    else {
      uVar9 = (ushort)left.data.symbol;
    }
    if (uVar5 < uVar9) {
      iVar4 = 1;
    }
    else {
      uVar6 = 0;
      uVar7 = 0;
      if (((ulong)left.ptr & 1) == 0) {
        uVar7 = (left.ptr)->child_count;
      }
      if (((ulong)right.ptr & 1) == 0) {
        uVar6 = (right.ptr)->child_count;
      }
      if (uVar6 <= uVar7) {
        uVar7 = 0;
        uVar10 = 0;
        if (((ulong)right.ptr & 1) == 0) {
          uVar10 = (right.ptr)->child_count;
        }
        if (((ulong)left.ptr & 1) == 0) {
          uVar7 = (left.ptr)->child_count;
        }
        iVar4 = 1;
        if (uVar7 <= uVar10) {
          iVar4 = 0;
          uVar7 = 0;
          if (((ulong)left.ptr & 1) == 0) {
            uVar7 = (left.ptr)->child_count;
          }
          if (uVar7 != 0) {
            pSVar1 = ((left.ptr)->field_17).field_0.children;
            pSVar2 = ((right.ptr)->field_17).field_0.children;
            uVar11 = 0;
            while( true ) {
              iVar4 = ts_subtree_compare(pSVar1[uVar11],pSVar2[uVar11]);
              bVar3 = false;
              if ((iVar4 != -1) && (bVar3 = false, iVar4 != 1)) {
                bVar3 = true;
                iVar4 = unaff_EBP;
              }
              if (!bVar3) break;
              uVar11 = uVar11 + 1;
              unaff_EBP = iVar4;
              if (uVar7 == uVar11) {
                return 0;
              }
            }
            return iVar4;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int ts_subtree_compare(Subtree left, Subtree right) {
  if (ts_subtree_symbol(left) < ts_subtree_symbol(right)) return -1;
  if (ts_subtree_symbol(right) < ts_subtree_symbol(left)) return 1;
  if (ts_subtree_child_count(left) < ts_subtree_child_count(right)) return -1;
  if (ts_subtree_child_count(right) < ts_subtree_child_count(left)) return 1;
  for (uint32_t i = 0, n = ts_subtree_child_count(left); i < n; i++) {
    Subtree left_child = left.ptr->children[i];
    Subtree right_child = right.ptr->children[i];
    switch (ts_subtree_compare(left_child, right_child)) {
      case -1: return -1;
      case 1: return 1;
      default: break;
    }
  }
  return 0;
}